

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

void __thiscall hdc::Driver::generateTAC(Driver *this)

{
  return;
}

Assistant:

void Driver::generateTAC() {
/*    std::map<std::string, SourceFile*>::iterator it;

    for (it = sourceFiles.begin(); it != sourceFiles.end(); ++it) {
        TACBuilderVisitor builder;
        it->second->accept(&builder);
        tacs = builder.getTACs();
        foobar();


        // for debug purposes
        for (int i = 0; i < tacs.size(); ++i) {
            std::cout << tacs[i].to_str_old(true) << '\n';
        }
    }*/
/*
    Graph<int> g;

    g.insertNode('a');
    g.insertNode('b');
    g.insertNode('c');
    g.insertNode('d');
    g.insertNode('e');
    g.insertNode('f');
    g.insertNode('g');

    g.makeEdge('a', 'b');
    g.makeEdge('a', 'd');
    g.makeEdge('a', 'f');
    g.makeEdge('a', 'g');

    g.makeEdge('b', 'c');
    g.makeEdge('b', 'd');
    g.makeEdge('b', 'e');

    g.makeEdge('c', 'd');
    g.makeEdge('c', 'e');

    g.makeEdge('d', 'g');
    g.makeEdge('d', 'f');

    g.makeEdge('e', 'g');
    g.makeEdge('e', 'f');

    g.makeEdge('f', 'g');

    g.coloring(4);
    std::cout << g.to_dot();*/
}